

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

void __thiscall Nova::Driver<float,_2>::Read_Time(Driver<float,_2> *this,int frame)

{
  Example<float,_2> *pEVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float corrected_time;
  string filename;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  pEVar1 = this->example;
  this->time = (float)(frame - pEVar1->first_frame) / pEVar1->frame_rate + pEVar1->initial_time;
  std::operator+(&local_30,&pEVar1->output_directory,"/");
  std::__cxx11::to_string(&local_50,frame);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &corrected_time,&local_30,&local_50);
  std::operator+(&filename,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &corrected_time,"/time");
  std::__cxx11::string::~string((string *)&corrected_time);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  bVar2 = File_Utilities::File_Exists(&filename,true);
  if (bVar2) {
    File_Utilities::Read_From_File<float>(&filename,&corrected_time);
    iVar3 = (int)this->time;
    iVar4 = (int)(this->time - corrected_time);
    iVar5 = -iVar4;
    if (0 < iVar4) {
      iVar5 = iVar4;
    }
    iVar4 = -iVar3;
    if (0 < iVar3) {
      iVar4 = iVar3;
    }
    if ((float)iVar4 * 0.0001 < (float)iVar5) {
      this->time = corrected_time;
      pEVar1 = this->example;
      pEVar1->initial_time =
           corrected_time - (float)(frame - pEVar1->first_frame) / pEVar1->frame_rate;
    }
  }
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

void Driver<T,d>::
Read_Time(const int frame)
{
    time=example.Time_At_Frame(frame);
    std::string filename=example.output_directory+"/"+std::to_string(frame)+"/time";
    if(File_Utilities::File_Exists(filename))
    {
        T corrected_time;
        File_Utilities::Read_From_File<T>(filename,corrected_time);
        if(abs(time-corrected_time)>(T)1e-4*abs(time))
        {   
            // only adjust time if significantly different from default in order to get deterministic restarts
            time=corrected_time;
            // adjust initial time so that Simulate_To_Frame() returns correct time (essential when writing substeps)
            example.initial_time=time-(frame-example.first_frame)/example.frame_rate;
        }
    }
}